

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string *
pugi::impl::anon_unknown_0::convert_number_to_string
          (xpath_string *__return_storage_ptr__,double value,xpath_allocator *alloc)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  xpath_string *pxVar8;
  char cVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  uint uVar13;
  bool bVar14;
  char mantissa_buffer [32];
  undefined8 local_58;
  double local_38;
  
  if ((value == 0.0) && (!NAN(value))) {
    pcVar3 = "0";
LAB_00130778:
    __return_storage_ptr__->_buffer = pcVar3;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    return (xpath_string *)pcVar3;
  }
  if (NAN(value)) {
    pcVar3 = "NaN";
    goto LAB_00130778;
  }
  if ((value + value == value) && (!NAN(value + value) && !NAN(value))) {
    pcVar3 = "-Infinity";
    if (0.0 < value) {
      pcVar3 = "Infinity";
    }
    goto LAB_00130778;
  }
  local_58 = value;
  local_38 = value;
  snprintf((char *)&local_58,0x20,"%.*e",0xf);
  pcVar4 = strchr((char *)&local_58,0x65);
  iVar2 = atoi(pcVar4 + 1);
  pcVar3 = (char *)((long)&local_58 + (ulong)((char)local_58 == '-') + 1);
  *pcVar3 = *(char *)((long)&local_58 + (ulong)((char)local_58 == '-'));
  do {
    pcVar6 = pcVar3;
    if (pcVar4 == pcVar3) break;
    pcVar10 = pcVar4 + -1;
    pcVar6 = pcVar4;
    pcVar4 = pcVar4 + -1;
  } while (*pcVar10 == '0');
  uVar13 = iVar2 + 1;
  *pcVar6 = '\0';
  sVar5 = strlen((char *)&local_58);
  uVar1 = -uVar13;
  if (0 < (int)uVar13) {
    uVar1 = uVar13;
  }
  pcVar4 = (char *)xpath_allocator::allocate(alloc,uVar1 + sVar5 + 4);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
    pxVar8 = (xpath_string *)0x0;
    sVar12 = 0;
    goto LAB_00130905;
  }
  pcVar6 = pcVar4;
  if (local_38 < 0.0) {
    pcVar6 = pcVar4 + 1;
    *pcVar4 = '-';
  }
  if (iVar2 < 0) {
    pcVar10 = pcVar6 + 1;
    *pcVar6 = '0';
    pcVar7 = pcVar4;
    if (*pcVar3 != '\0') {
      pcVar6[1] = '.';
      pcVar11 = pcVar6 + 2;
      pcVar6 = pcVar4;
      if (iVar2 != -1) {
        pcVar6 = (char *)memset(pcVar11,0x30,(ulong)(-iVar2 - 2) + 1);
        pcVar11 = pcVar10 + (ulong)(-iVar2 - 2) + 2;
      }
      goto LAB_001308dd;
    }
  }
  else {
    uVar13 = iVar2 + 2;
    do {
      pcVar11 = pcVar6;
      cVar9 = *pcVar3;
      bVar14 = cVar9 != '\0';
      if (!bVar14) {
        cVar9 = '0';
      }
      pcVar3 = pcVar3 + bVar14;
      *pcVar11 = cVar9;
      pcVar10 = pcVar11 + 1;
      uVar13 = uVar13 - 1;
      pcVar6 = pcVar10;
    } while (1 < uVar13);
    pcVar7 = (char *)0x0;
    if (*pcVar3 != '\0') {
      *pcVar10 = '.';
      pcVar11 = pcVar11 + 2;
      pcVar6 = (char *)0x0;
LAB_001308dd:
      cVar9 = *pcVar3;
      pcVar7 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),cVar9);
      pcVar10 = pcVar11;
      while (cVar9 != '\0') {
        pcVar3 = pcVar3 + 1;
        *pcVar10 = (char)pcVar7;
        pcVar10 = pcVar10 + 1;
        cVar9 = *pcVar3;
        pcVar7 = (char *)CONCAT71((int7)((ulong)pcVar7 >> 8),cVar9);
      }
    }
  }
  *pcVar10 = '\0';
  sVar12 = (long)pcVar10 - (long)pcVar4;
  pxVar8 = (xpath_string *)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
LAB_00130905:
  __return_storage_ptr__->_buffer = pcVar4;
  __return_storage_ptr__->_uses_heap = SUB81(pxVar8,0);
  __return_storage_ptr__->_length_heap = sVar12;
  return pxVar8;
}

Assistant:

PUGI_IMPL_FN xpath_string convert_number_to_string(double value, xpath_allocator* alloc)
	{
		// try special number conversion
		const char_t* special = convert_number_to_string_special(value);
		if (special) return xpath_string::from_const(special);

		// get mantissa + exponent form
		char mantissa_buffer[32];

		char* mantissa;
		int exponent;
		convert_number_to_mantissa_exponent(value, mantissa_buffer, &mantissa, &exponent);

		// allocate a buffer of suitable length for the number
		size_t result_size = strlen(mantissa_buffer) + (exponent > 0 ? exponent : -exponent) + 4;
		char_t* result = static_cast<char_t*>(alloc->allocate(sizeof(char_t) * result_size));
		if (!result) return xpath_string();

		// make the number!
		char_t* s = result;

		// sign
		if (value < 0) *s++ = '-';

		// integer part
		if (exponent <= 0)
		{
			*s++ = '0';
		}
		else
		{
			while (exponent > 0)
			{
				assert(*mantissa == 0 || static_cast<unsigned int>(*mantissa - '0') <= 9);
				*s++ = *mantissa ? *mantissa++ : '0';
				exponent--;
			}
		}

		// fractional part
		if (*mantissa)
		{
			// decimal point
			*s++ = '.';

			// extra zeroes from negative exponent
			while (exponent < 0)
			{
				*s++ = '0';
				exponent++;
			}

			// extra mantissa digits
			while (*mantissa)
			{
				assert(static_cast<unsigned int>(*mantissa - '0') <= 9);
				*s++ = *mantissa++;
			}
		}

		// zero-terminate
		assert(s < result + result_size);
		*s = 0;

		return xpath_string::from_heap_preallocated(result, s);
	}